

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O1

void __thiscall t_program::t_program(t_program *this,string *path)

{
  pointer pcVar1;
  t_scope *__s;
  _Rb_tree_header *p_Var2;
  string local_70;
  string local_50;
  
  (this->super_t_doc).doc_._M_dataplus._M_p = (pointer)&(this->super_t_doc).doc_.field_2;
  (this->super_t_doc).doc_._M_string_length = 0;
  (this->super_t_doc).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_t_doc).has_doc_ = false;
  (this->super_t_doc)._vptr_t_doc = (_func_int **)&PTR__t_program_0040ebc0;
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar1,pcVar1 + path->_M_string_length);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->out_path_)._M_dataplus._M_p = (pointer)&(this->out_path_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->out_path_,"./","");
  this->out_path_is_absolute_ = false;
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  (this->namespace_)._M_string_length = 0;
  (this->namespace_).field_2._M_local_buf[0] = '\0';
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->include_prefix_)._M_dataplus._M_p = (pointer)&(this->include_prefix_).field_2;
  (this->include_prefix_)._M_string_length = 0;
  (this->include_prefix_).field_2._M_local_buf[0] = '\0';
  p_Var2 = &(this->namespaces_)._M_t._M_impl.super__Rb_tree_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->typedefs_,0,0xa8);
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->namespace_annotations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cpp_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c_includes_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + path->_M_string_length);
  program_name(&local_50,&local_70);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  __s = (t_scope *)operator_new(0x90);
  p_Var2 = &(__s->types_)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0x90);
  (__s->types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (__s->types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (__s->types_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__s->constants_)._M_t._M_impl.super__Rb_tree_header;
  (__s->constants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__s->constants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__s->constants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (__s->constants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (__s->constants_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__s->services_)._M_t._M_impl.super__Rb_tree_header;
  (__s->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__s->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__s->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (__s->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (__s->services_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->scope_ = __s;
  return;
}

Assistant:

t_program(std::string path) : path_(path), out_path_("./"), out_path_is_absolute_(false), recursive_(false) {
    name_ = program_name(path);
    scope_ = new t_scope();
  }